

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIImageList::draw(CGUIImageList *this,s32 index,vector2d<int> *destPos,rect<int> *clip)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  rect<int> sourceRect;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  if (((-1 < index) &&
      (plVar2 = *(long **)&(this->super_IGUIImageList).field_0x8, plVar2 != (long *)0x0)) &&
     (index < *(int *)&(this->super_IGUIImageList).field_0x18)) {
    iVar1 = *(int *)&(this->super_IGUIImageList).field_0x1c;
    iVar4 = (index % this->ImagesPerRow) * iVar1;
    iVar3 = (index / this->ImagesPerRow) * *(int *)&this->field_0x20;
    _local_18 = CONCAT44(iVar3,iVar4);
    _iStack_10 = CONCAT44(iVar3 + *(int *)&this->field_0x20,iVar4 + iVar1);
    (**(code **)(*plVar2 + 0x180))
              (plVar2,*(undefined8 *)&(this->super_IGUIImageList).field_0x10,destPos,&local_18,clip,
               0xffffffff,this->UseAlphaChannel);
  }
  return;
}

Assistant:

void CGUIImageList::draw(s32 index, const core::position2d<s32> &destPos,
		const core::rect<s32> *clip /*= 0*/)
{
	core::rect<s32> sourceRect;

	if (!Driver || index < 0 || index >= ImageCount) {
		return;
	}

	sourceRect.UpperLeftCorner.X = (index % ImagesPerRow) * ImageSize.Width;
	sourceRect.UpperLeftCorner.Y = (index / ImagesPerRow) * ImageSize.Height;
	sourceRect.LowerRightCorner.X = sourceRect.UpperLeftCorner.X + ImageSize.Width;
	sourceRect.LowerRightCorner.Y = sourceRect.UpperLeftCorner.Y + ImageSize.Height;

	Driver->draw2DImage(Texture, destPos, sourceRect, clip,
			video::SColor(255, 255, 255, 255), UseAlphaChannel);
}